

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_vertex.cxx
# Opt level: O3

void __thiscall Fl_Graphics_Driver::end_line(Fl_Graphics_Driver *this)

{
  if (this->n < 2) {
    (*(this->super_Fl_Device)._vptr_Fl_Device[0x22])();
    return;
  }
  XDrawLines(fl_display,fl_window,fl_gc,this->p,this->n,0);
  return;
}

Assistant:

void Fl_Graphics_Driver::end_line() {
  if (n < 2) {
    end_points();
    return;
  }
#if defined(USE_X11)
  if (n>1) XDrawLines(fl_display, fl_window, fl_gc, p, n, 0);
#elif defined(WIN32)
  if (n>1) Polyline(fl_gc, p, n);
#elif defined(__APPLE_QUARTZ__)
  if (n<=1) return;
  CGContextSetShouldAntialias(fl_gc, true);
  CGContextMoveToPoint(fl_gc, p[0].x, p[0].y);
  for (int i=1; i<n; i++)
    CGContextAddLineToPoint(fl_gc, p[i].x, p[i].y);
  CGContextStrokePath(fl_gc);
  CGContextSetShouldAntialias(fl_gc, false);
#else
# error unsupported platform
#endif
}